

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_layer_interface.cpp
# Opt level: O2

void __thiscall
ApiLayerInterface::ApiLayerInterface
          (ApiLayerInterface *this,string *layer_name,LoaderPlatformLibraryHandle layer_library,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *supported_extensions,PFN_xrGetInstanceProcAddr get_instance_proc_addr,
          PFN_xrCreateApiLayerInstance create_api_layer_instance)

{
  this->_vptr_ApiLayerInterface = (_func_int **)&PTR__ApiLayerInterface_001499a0;
  std::__cxx11::string::string((string *)&this->_layer_name,(string *)layer_name);
  this->_layer_library = layer_library;
  this->_get_instance_proc_addr = get_instance_proc_addr;
  this->_create_api_layer_instance = create_api_layer_instance;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->_supported_extensions,supported_extensions);
  return;
}

Assistant:

ApiLayerInterface::ApiLayerInterface(const std::string& layer_name, LoaderPlatformLibraryHandle layer_library,
                                     std::vector<std::string>& supported_extensions,
                                     PFN_xrGetInstanceProcAddr get_instance_proc_addr,
                                     PFN_xrCreateApiLayerInstance create_api_layer_instance)
    : _layer_name(layer_name),
      _layer_library(layer_library),
      _get_instance_proc_addr(get_instance_proc_addr),
      _create_api_layer_instance(create_api_layer_instance),
      _supported_extensions(supported_extensions) {}